

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

void __thiscall el::base::VRegistry::VRegistry(VRegistry *this,VerboseLevel level,EnumType *pFlags)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_001eb320;
  *(VerboseLevel *)&(this->super_ThreadSafe).field_0xa = level;
  this->m_pFlags = pFlags;
  p_Var1 = &(this->m_modules)._M_t._M_impl.super__Rb_tree_header;
  (this->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_modules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

VRegistry::VRegistry(base::type::VerboseLevel level, base::type::EnumType* pFlags) : m_level(level), m_pFlags(pFlags) {
}